

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneParser.cpp
# Opt level: O2

void __thiscall SceneParser::parseMaterials(SceneParser *this)

{
  int iVar1;
  int iVar2;
  Material *local_a0;
  char token [100];
  
  getToken(this,token);
  if (token._0_2_ != 0x7b) {
    __assert_fail("!strcmp(token, \"{\")",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                  ,0xb0,"void SceneParser::parseMaterials()");
  }
  getToken(this,token);
  iVar1 = bcmp(token,"numMaterials",0xd);
  if (iVar1 == 0) {
    iVar1 = readInt(this);
    this->_num_materials = iVar1;
    iVar2 = 0;
    do {
      getToken(this,token);
      if (iVar1 <= iVar2) {
        if (token._0_2_ == 0x7d) {
          return;
        }
        __assert_fail("!strcmp(token, \"}\")",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                      ,0xc5,"void SceneParser::parseMaterials()");
      }
      iVar1 = bcmp(token,"Material",9);
      if (iVar1 != 0) {
        iVar1 = bcmp(token,"PhongMaterial",0xe);
        if (iVar1 != 0) {
          printf("Unknown token in parseMaterial: \'%s\'\n",token);
          exit(0);
        }
      }
      local_a0 = parseMaterial(this);
      std::vector<Material*,std::allocator<Material*>>::emplace_back<Material*>
                ((vector<Material*,std::allocator<Material*>> *)&this->_materials,&local_a0);
      iVar2 = iVar2 + 1;
      iVar1 = this->_num_materials;
    } while( true );
  }
  __assert_fail("!strcmp(token, \"numMaterials\")",
                "/workspace/llm4binary/github/license_all_cmakelists_25/collinsgit[P]metro-caster/src/SceneParser.cpp"
                ,0xb4,"void SceneParser::parseMaterials()");
}

Assistant:

void
SceneParser::parseMaterials() {
    // Ensure the structure is valid.
    char token[MAX_PARSER_TOKEN_LENGTH];
    getToken(token);
    assert(!strcmp(token, "{"));

    // Read in the number of objects.
    getToken(token);
    assert(!strcmp(token, "numMaterials"));
    _num_materials = readInt();

    // Read in the objects.
    int count = 0;
    while (_num_materials > count) {
        getToken(token);
        if (!strcmp(token, "Material") ||
            !strcmp(token, "PhongMaterial")) {
            _materials.push_back(parseMaterial());
        } else {
            printf("Unknown token in parseMaterial: '%s'\n", token);
            exit(0);
        }
        count++;
    }
    getToken(token);
    assert(!strcmp(token, "}"));
}